

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_lexer.cpp
# Opt level: O1

void __thiscall Lexer_Floats_Test::TestBody(Lexer_Floats_Test *this)

{
  int *lhs;
  anon_union_8_2_0c43866c_for_TkInfo_4 *this_00;
  int *lxr;
  int *lhs_00;
  bool bVar1;
  char *pcVar2;
  undefined1 local_1c0 [8];
  MockLexer mock;
  AssertionResult gtest_ar;
  AssertHelper local_40;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  
  vm_new();
  lex_new((Lexer *)&mock.lxr.tk.field_4,(VM *)local_1c0,(char *)0x0,
          "3.0 4.0000 3.1415926535 3. 42.09 3e4 3e+4 3e-4 3.14e2 42.51E2");
  lxr = &mock.vm.stack_size;
  mock.lxr.path = (char *)gtest_ar.message_.ptr_;
  mock.lxr.vm = (VM *)gtest_ar._0_8_;
  lex_next((Lexer *)lxr);
  lhs_00 = &mock.lxr.cursor;
  local_38.ptr_._0_4_ = 0x115;
  testing::internal::CmpHelperEQ<int,multi_tks>
            ((internal *)&mock.lxr.tk.field_4,"mock.lxr.tk.type","TK_NUM",lhs_00,
             (multi_tks *)&local_38);
  if (mock.lxr.tk.field_4.ident_hash._0_1_ == '\0') {
    testing::Message::Message((Message *)&local_38);
    if (gtest_ar._0_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_lexer.cpp"
               ,0x9e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_38.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_38.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_38.ptr_ + 8))();
      }
      local_38.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    lhs = &mock.lxr.tk.length;
    local_38.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         &DAT_4008000000000000;
    this_00 = &mock.lxr.tk.field_4;
    testing::internal::CmpHelperEQ<double,double>
              ((internal *)this_00,"mock.lxr.tk.num","3.0",(double *)lhs,(double *)&local_38);
    if (mock.lxr.tk.field_4.ident_hash._0_1_ == '\0') {
      testing::Message::Message((Message *)&local_38);
      if (gtest_ar._0_8_ == 0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_40,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_lexer.cpp"
                 ,0x9f,pcVar2);
      testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
      testing::internal::AssertHelper::~AssertHelper(&local_40);
      if (local_38.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           (local_38.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_38.ptr_ + 8))();
        }
        local_38.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      lex_next((Lexer *)lxr);
      local_38.ptr_._0_4_ = 0x115;
      testing::internal::CmpHelperEQ<int,multi_tks>
                ((internal *)this_00,"mock.lxr.tk.type","TK_NUM",lhs_00,(multi_tks *)&local_38);
      if (mock.lxr.tk.field_4.ident_hash._0_1_ == '\0') {
        testing::Message::Message((Message *)&local_38);
        if (gtest_ar._0_8_ == 0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_40,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_lexer.cpp"
                   ,0xa0,pcVar2);
        testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
        testing::internal::AssertHelper::~AssertHelper(&local_40);
        if (local_38.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_38.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_38.ptr_ + 8))();
          }
          local_38.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_38.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &DAT_4010000000000000;
        testing::internal::CmpHelperEQ<double,double>
                  ((internal *)this_00,"mock.lxr.tk.num","4.0",(double *)lhs,(double *)&local_38);
        if (mock.lxr.tk.field_4.ident_hash._0_1_ == '\0') {
          testing::Message::Message((Message *)&local_38);
          if (gtest_ar._0_8_ == 0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = *(char **)gtest_ar._0_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_40,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_lexer.cpp"
                     ,0xa1,pcVar2);
          testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
          testing::internal::AssertHelper::~AssertHelper(&local_40);
          if (local_38.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) &&
               (local_38.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_38.ptr_ + 8))();
            }
            local_38.ptr_ =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        }
        else {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          lex_next((Lexer *)lxr);
          local_38.ptr_._0_4_ = 0x115;
          testing::internal::CmpHelperEQ<int,multi_tks>
                    ((internal *)this_00,"mock.lxr.tk.type","TK_NUM",lhs_00,(multi_tks *)&local_38);
          if (mock.lxr.tk.field_4.ident_hash._0_1_ == '\0') {
            testing::Message::Message((Message *)&local_38);
            if (gtest_ar._0_8_ == 0) {
              pcVar2 = "";
            }
            else {
              pcVar2 = *(char **)gtest_ar._0_8_;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_40,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_lexer.cpp"
                       ,0xa2,pcVar2);
            testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
            testing::internal::AssertHelper::~AssertHelper(&local_40);
            if (local_38.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              bVar1 = testing::internal::IsTrue(true);
              if ((bVar1) &&
                 (local_38.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
                (**(code **)(*(long *)local_38.ptr_ + 8))();
              }
              local_38.ptr_ =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          }
          else {
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            local_38.ptr_ =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &DAT_400921fb54411744;
            testing::internal::CmpHelperEQ<double,double>
                      ((internal *)this_00,"mock.lxr.tk.num","3.1415926535",(double *)lhs,
                       (double *)&local_38);
            if (mock.lxr.tk.field_4.ident_hash._0_1_ == '\0') {
              testing::Message::Message((Message *)&local_38);
              if (gtest_ar._0_8_ == 0) {
                pcVar2 = "";
              }
              else {
                pcVar2 = *(char **)gtest_ar._0_8_;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_40,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_lexer.cpp"
                         ,0xa3,pcVar2);
              testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
              testing::internal::AssertHelper::~AssertHelper(&local_40);
              if (local_38.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                bVar1 = testing::internal::IsTrue(true);
                if ((bVar1) &&
                   (local_38.ptr_ !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0))
                {
                  (**(code **)(*(long *)local_38.ptr_ + 8))();
                }
                local_38.ptr_ =
                     (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            }
            else {
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              lex_next((Lexer *)lxr);
              local_38.ptr_._0_4_ = 0x115;
              testing::internal::CmpHelperEQ<int,multi_tks>
                        ((internal *)this_00,"mock.lxr.tk.type","TK_NUM",lhs_00,
                         (multi_tks *)&local_38);
              if (mock.lxr.tk.field_4.ident_hash._0_1_ == '\0') {
                testing::Message::Message((Message *)&local_38);
                if (gtest_ar._0_8_ == 0) {
                  pcVar2 = "";
                }
                else {
                  pcVar2 = *(char **)gtest_ar._0_8_;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_40,kFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_lexer.cpp"
                           ,0xa4,pcVar2);
                testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
                testing::internal::AssertHelper::~AssertHelper(&local_40);
                if (local_38.ptr_ !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                {
                  bVar1 = testing::internal::IsTrue(true);
                  if ((bVar1) &&
                     (local_38.ptr_ !=
                      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                     )) {
                    (**(code **)(*(long *)local_38.ptr_ + 8))();
                  }
                  local_38.ptr_ =
                       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       0x0;
                }
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&gtest_ar,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              }
              else {
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&gtest_ar,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
                local_38.ptr_ =
                     (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &DAT_4008000000000000;
                testing::internal::CmpHelperEQ<double,double>
                          ((internal *)this_00,"mock.lxr.tk.num","3.0",(double *)lhs,
                           (double *)&local_38);
                if (mock.lxr.tk.field_4.ident_hash._0_1_ == '\0') {
                  testing::Message::Message((Message *)&local_38);
                  if (gtest_ar._0_8_ == 0) {
                    pcVar2 = "";
                  }
                  else {
                    pcVar2 = *(char **)gtest_ar._0_8_;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            (&local_40,kFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_lexer.cpp"
                             ,0xa5,pcVar2);
                  testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
                  testing::internal::AssertHelper::~AssertHelper(&local_40);
                  if (local_38.ptr_ !=
                      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                     ) {
                    bVar1 = testing::internal::IsTrue(true);
                    if ((bVar1) &&
                       (local_38.ptr_ !=
                        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x0)) {
                      (**(code **)(*(long *)local_38.ptr_ + 8))();
                    }
                    local_38.ptr_ =
                         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x0;
                  }
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&gtest_ar,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
                }
                else {
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&gtest_ar,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
                  lex_next((Lexer *)lxr);
                  local_38.ptr_._0_4_ = 0x115;
                  testing::internal::CmpHelperEQ<int,multi_tks>
                            ((internal *)this_00,"mock.lxr.tk.type","TK_NUM",lhs_00,
                             (multi_tks *)&local_38);
                  if (mock.lxr.tk.field_4.ident_hash._0_1_ == '\0') {
                    testing::Message::Message((Message *)&local_38);
                    if (gtest_ar._0_8_ == 0) {
                      pcVar2 = "";
                    }
                    else {
                      pcVar2 = *(char **)gtest_ar._0_8_;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              (&local_40,kFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_lexer.cpp"
                               ,0xa6,pcVar2);
                    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
                    testing::internal::AssertHelper::~AssertHelper(&local_40);
                    if (local_38.ptr_ !=
                        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x0) {
                      bVar1 = testing::internal::IsTrue(true);
                      if ((bVar1) &&
                         (local_38.ptr_ !=
                          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *
                          )0x0)) {
                        (**(code **)(*(long *)local_38.ptr_ + 8))();
                      }
                      local_38.ptr_ =
                           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                            *)0x0;
                    }
                    testing::internal::
                    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&gtest_ar,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           );
                  }
                  else {
                    testing::internal::
                    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&gtest_ar,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           );
                    local_38.ptr_ =
                         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &DAT_40450b851eb851ec;
                    testing::internal::CmpHelperEQ<double,double>
                              ((internal *)this_00,"mock.lxr.tk.num","42.09",(double *)lhs,
                               (double *)&local_38);
                    if (mock.lxr.tk.field_4.ident_hash._0_1_ == '\0') {
                      testing::Message::Message((Message *)&local_38);
                      if (gtest_ar._0_8_ == 0) {
                        pcVar2 = "";
                      }
                      else {
                        pcVar2 = *(char **)gtest_ar._0_8_;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                (&local_40,kFatalFailure,
                                 "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_lexer.cpp"
                                 ,0xa7,pcVar2);
                      testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
                      testing::internal::AssertHelper::~AssertHelper(&local_40);
                      if (local_38.ptr_ !=
                          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *
                          )0x0) {
                        bVar1 = testing::internal::IsTrue(true);
                        if ((bVar1) &&
                           (local_38.ptr_ !=
                            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                             *)0x0)) {
                          (**(code **)(*(long *)local_38.ptr_ + 8))();
                        }
                        local_38.ptr_ =
                             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                              *)0x0;
                      }
                      testing::internal::
                      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&gtest_ar,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0);
                    }
                    else {
                      testing::internal::
                      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&gtest_ar,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0);
                      lex_next((Lexer *)lxr);
                      local_38.ptr_._0_4_ = 0x115;
                      testing::internal::CmpHelperEQ<int,multi_tks>
                                ((internal *)this_00,"mock.lxr.tk.type","TK_NUM",lhs_00,
                                 (multi_tks *)&local_38);
                      if (mock.lxr.tk.field_4.ident_hash._0_1_ == '\0') {
                        testing::Message::Message((Message *)&local_38);
                        if (gtest_ar._0_8_ == 0) {
                          pcVar2 = "";
                        }
                        else {
                          pcVar2 = *(char **)gtest_ar._0_8_;
                        }
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_40,kFatalFailure,
                                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_lexer.cpp"
                                   ,0xa8,pcVar2);
                        testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
                        testing::internal::AssertHelper::~AssertHelper(&local_40);
                        if (local_38.ptr_ !=
                            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                             *)0x0) {
                          bVar1 = testing::internal::IsTrue(true);
                          if ((bVar1) &&
                             (local_38.ptr_ !=
                              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                               *)0x0)) {
                            (**(code **)(*(long *)local_38.ptr_ + 8))();
                          }
                          local_38.ptr_ =
                               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                *)0x0;
                        }
                        testing::internal::
                        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&gtest_ar,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0);
                      }
                      else {
                        testing::internal::
                        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&gtest_ar,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0);
                        local_38.ptr_ =
                             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                              *)&DAT_40dd4c0000000000;
                        testing::internal::CmpHelperEQ<double,double>
                                  ((internal *)this_00,"mock.lxr.tk.num","30000.0",(double *)lhs,
                                   (double *)&local_38);
                        if (mock.lxr.tk.field_4.ident_hash._0_1_ == '\0') {
                          testing::Message::Message((Message *)&local_38);
                          if (gtest_ar._0_8_ == 0) {
                            pcVar2 = "";
                          }
                          else {
                            pcVar2 = *(char **)gtest_ar._0_8_;
                          }
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_40,kFatalFailure,
                                     "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_lexer.cpp"
                                     ,0xa9,pcVar2);
                          testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38)
                          ;
                          testing::internal::AssertHelper::~AssertHelper(&local_40);
                          if (local_38.ptr_ !=
                              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                               *)0x0) {
                            bVar1 = testing::internal::IsTrue(true);
                            if ((bVar1) &&
                               (local_38.ptr_ !=
                                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                 *)0x0)) {
                              (**(code **)(*(long *)local_38.ptr_ + 8))();
                            }
                            local_38.ptr_ =
                                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)0x0;
                          }
                          testing::internal::
                          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)&gtest_ar,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0);
                        }
                        else {
                          testing::internal::
                          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)&gtest_ar,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0);
                          lex_next((Lexer *)lxr);
                          local_38.ptr_._0_4_ = 0x115;
                          testing::internal::CmpHelperEQ<int,multi_tks>
                                    ((internal *)this_00,"mock.lxr.tk.type","TK_NUM",lhs_00,
                                     (multi_tks *)&local_38);
                          if (mock.lxr.tk.field_4.ident_hash._0_1_ == '\0') {
                            testing::Message::Message((Message *)&local_38);
                            if (gtest_ar._0_8_ == 0) {
                              pcVar2 = "";
                            }
                            else {
                              pcVar2 = *(char **)gtest_ar._0_8_;
                            }
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_40,kFatalFailure,
                                       "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_lexer.cpp"
                                       ,0xaa,pcVar2);
                            testing::internal::AssertHelper::operator=
                                      (&local_40,(Message *)&local_38);
                          }
                          else {
                            testing::AssertionResult::~AssertionResult
                                      ((AssertionResult *)&mock.lxr.tk.field_4);
                            local_38.ptr_ =
                                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&DAT_40dd4c0000000000;
                            testing::internal::CmpHelperEQ<double,double>
                                      ((internal *)this_00,"mock.lxr.tk.num","30000.0",(double *)lhs
                                       ,(double *)&local_38);
                            if (mock.lxr.tk.field_4.ident_hash._0_1_ == '\0') {
                              testing::Message::Message((Message *)&local_38);
                              if (gtest_ar._0_8_ == 0) {
                                pcVar2 = "";
                              }
                              else {
                                pcVar2 = *(char **)gtest_ar._0_8_;
                              }
                              testing::internal::AssertHelper::AssertHelper
                                        (&local_40,kFatalFailure,
                                         "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_lexer.cpp"
                                         ,0xab,pcVar2);
                              testing::internal::AssertHelper::operator=
                                        (&local_40,(Message *)&local_38);
                            }
                            else {
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)&mock.lxr.tk.field_4);
                              lex_next((Lexer *)lxr);
                              local_38.ptr_._0_4_ = 0x115;
                              testing::internal::CmpHelperEQ<int,multi_tks>
                                        ((internal *)this_00,"mock.lxr.tk.type","TK_NUM",lhs_00,
                                         (multi_tks *)&local_38);
                              if (mock.lxr.tk.field_4.ident_hash._0_1_ == '\0') {
                                testing::Message::Message((Message *)&local_38);
                                if (gtest_ar._0_8_ == 0) {
                                  pcVar2 = "";
                                }
                                else {
                                  pcVar2 = *(char **)gtest_ar._0_8_;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_40,kFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_lexer.cpp"
                                           ,0xac,pcVar2);
                                testing::internal::AssertHelper::operator=
                                          (&local_40,(Message *)&local_38);
                              }
                              else {
                                testing::AssertionResult::~AssertionResult
                                          ((AssertionResult *)&mock.lxr.tk.field_4);
                                local_38.ptr_ =
                                     (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)0x3f33a92a30553261;
                                testing::internal::CmpHelperEQ<double,double>
                                          ((internal *)this_00,"mock.lxr.tk.num","0.0003",
                                           (double *)lhs,(double *)&local_38);
                                if (mock.lxr.tk.field_4.ident_hash._0_1_ == '\0') {
                                  testing::Message::Message((Message *)&local_38);
                                  if (gtest_ar._0_8_ == 0) {
                                    pcVar2 = "";
                                  }
                                  else {
                                    pcVar2 = *(char **)gtest_ar._0_8_;
                                  }
                                  testing::internal::AssertHelper::AssertHelper
                                            (&local_40,kFatalFailure,
                                             "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_lexer.cpp"
                                             ,0xad,pcVar2);
                                  testing::internal::AssertHelper::operator=
                                            (&local_40,(Message *)&local_38);
                                }
                                else {
                                  testing::AssertionResult::~AssertionResult
                                            ((AssertionResult *)&mock.lxr.tk.field_4);
                                  lex_next((Lexer *)lxr);
                                  local_38.ptr_._0_4_ = 0x115;
                                  testing::internal::CmpHelperEQ<int,multi_tks>
                                            ((internal *)this_00,"mock.lxr.tk.type","TK_NUM",lhs_00,
                                             (multi_tks *)&local_38);
                                  if (mock.lxr.tk.field_4.ident_hash._0_1_ == '\0') {
                                    testing::Message::Message((Message *)&local_38);
                                    if (gtest_ar._0_8_ == 0) {
                                      pcVar2 = "";
                                    }
                                    else {
                                      pcVar2 = *(char **)gtest_ar._0_8_;
                                    }
                                    testing::internal::AssertHelper::AssertHelper
                                              (&local_40,kFatalFailure,
                                               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_lexer.cpp"
                                               ,0xae,pcVar2);
                                    testing::internal::AssertHelper::operator=
                                              (&local_40,(Message *)&local_38);
                                  }
                                  else {
                                    testing::AssertionResult::~AssertionResult
                                              ((AssertionResult *)&mock.lxr.tk.field_4);
                                    local_38.ptr_ =
                                         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)0x4073a00000000000;
                                    testing::internal::CmpHelperEQ<double,double>
                                              ((internal *)this_00,"mock.lxr.tk.num","314.0",
                                               (double *)lhs,(double *)&local_38);
                                    if (mock.lxr.tk.field_4.ident_hash._0_1_ == '\0') {
                                      testing::Message::Message((Message *)&local_38);
                                      if (gtest_ar._0_8_ == 0) {
                                        pcVar2 = "";
                                      }
                                      else {
                                        pcVar2 = *(char **)gtest_ar._0_8_;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_40,kFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_lexer.cpp"
                                                 ,0xaf,pcVar2);
                                      testing::internal::AssertHelper::operator=
                                                (&local_40,(Message *)&local_38);
                                    }
                                    else {
                                      testing::AssertionResult::~AssertionResult
                                                ((AssertionResult *)&mock.lxr.tk.field_4);
                                      lex_next((Lexer *)lxr);
                                      local_38.ptr_._0_4_ = 0x115;
                                      testing::internal::CmpHelperEQ<int,multi_tks>
                                                ((internal *)this_00,"mock.lxr.tk.type","TK_NUM",
                                                 lhs_00,(multi_tks *)&local_38);
                                      if (mock.lxr.tk.field_4.ident_hash._0_1_ == '\0') {
                                        testing::Message::Message((Message *)&local_38);
                                        if (gtest_ar._0_8_ == 0) {
                                          pcVar2 = "";
                                        }
                                        else {
                                          pcVar2 = *(char **)gtest_ar._0_8_;
                                        }
                                        testing::internal::AssertHelper::AssertHelper
                                                  (&local_40,kFatalFailure,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_lexer.cpp"
                                                  ,0xb0,pcVar2);
                                        testing::internal::AssertHelper::operator=
                                                  (&local_40,(Message *)&local_38);
                                      }
                                      else {
                                        testing::AssertionResult::~AssertionResult
                                                  ((AssertionResult *)&mock.lxr.tk.field_4);
                                        local_38.ptr_ =
                                             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)0x40b09b0000000000;
                                        testing::internal::CmpHelperEQ<double,double>
                                                  ((internal *)this_00,"mock.lxr.tk.num","4251.0",
                                                   (double *)lhs,(double *)&local_38);
                                        if (mock.lxr.tk.field_4.ident_hash._0_1_ == '\0') {
                                          testing::Message::Message((Message *)&local_38);
                                          if (gtest_ar._0_8_ == 0) {
                                            pcVar2 = "";
                                          }
                                          else {
                                            pcVar2 = *(char **)gtest_ar._0_8_;
                                          }
                                          testing::internal::AssertHelper::AssertHelper
                                                    (&local_40,kFatalFailure,
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_lexer.cpp"
                                                  ,0xb1,pcVar2);
                                          testing::internal::AssertHelper::operator=
                                                    (&local_40,(Message *)&local_38);
                                        }
                                        else {
                                          testing::AssertionResult::~AssertionResult
                                                    ((AssertionResult *)&mock.lxr.tk.field_4);
                                          lex_next((Lexer *)lxr);
                                          local_38.ptr_._0_4_ = 0x119;
                                          testing::internal::CmpHelperEQ<int,multi_tks>
                                                    ((internal *)&mock.lxr.tk.field_4,
                                                     "mock.lxr.tk.type","TK_EOF",lhs_00,
                                                     (multi_tks *)&local_38);
                                          if (mock.lxr.tk.field_4.ident_hash._0_1_ != '\0') {
                                            testing::AssertionResult::~AssertionResult
                                                      ((AssertionResult *)&mock.lxr.tk.field_4);
                                            vm_free((VM *)local_1c0);
                                            return;
                                          }
                                          testing::Message::Message((Message *)&local_38);
                                          if (gtest_ar._0_8_ == 0) {
                                            pcVar2 = "";
                                          }
                                          else {
                                            pcVar2 = *(char **)gtest_ar._0_8_;
                                          }
                                          testing::internal::AssertHelper::AssertHelper
                                                    (&local_40,kFatalFailure,
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_lexer.cpp"
                                                  ,0xb2,pcVar2);
                                          testing::internal::AssertHelper::operator=
                                                    (&local_40,(Message *)&local_38);
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                          testing::internal::AssertHelper::~AssertHelper(&local_40);
                          testing::Message::~Message((Message *)&local_38);
                          testing::AssertionResult::~AssertionResult
                                    ((AssertionResult *)&mock.lxr.tk.field_4);
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

TEST(Lexer, Floats) {
	MockLexer mock = mock_new("3.0 4.0000 3.1415926535 3. 42.09 3e4 3e+4 "
		"3e-4 3.14e2 42.51E2");
	lex_next(&mock.lxr); ASSERT_EQ(mock.lxr.tk.type, TK_NUM);
	ASSERT_EQ(mock.lxr.tk.num, 3.0);
	lex_next(&mock.lxr); ASSERT_EQ(mock.lxr.tk.type, TK_NUM);
	ASSERT_EQ(mock.lxr.tk.num, 4.0);
	lex_next(&mock.lxr); ASSERT_EQ(mock.lxr.tk.type, TK_NUM);
	ASSERT_EQ(mock.lxr.tk.num, 3.1415926535);
	lex_next(&mock.lxr); ASSERT_EQ(mock.lxr.tk.type, TK_NUM);
	ASSERT_EQ(mock.lxr.tk.num, 3.0);
	lex_next(&mock.lxr); ASSERT_EQ(mock.lxr.tk.type, TK_NUM);
	ASSERT_EQ(mock.lxr.tk.num, 42.09);
	lex_next(&mock.lxr); ASSERT_EQ(mock.lxr.tk.type, TK_NUM);
	ASSERT_EQ(mock.lxr.tk.num, 30000.0);
	lex_next(&mock.lxr); ASSERT_EQ(mock.lxr.tk.type, TK_NUM);
	ASSERT_EQ(mock.lxr.tk.num, 30000.0);
	lex_next(&mock.lxr); ASSERT_EQ(mock.lxr.tk.type, TK_NUM);
	ASSERT_EQ(mock.lxr.tk.num, 0.0003);
	lex_next(&mock.lxr); ASSERT_EQ(mock.lxr.tk.type, TK_NUM);
	ASSERT_EQ(mock.lxr.tk.num, 314.0);
	lex_next(&mock.lxr); ASSERT_EQ(mock.lxr.tk.type, TK_NUM);
	ASSERT_EQ(mock.lxr.tk.num, 4251.0);
	lex_next(&mock.lxr); ASSERT_EQ(mock.lxr.tk.type, TK_EOF);
	mock_free(&mock);
}